

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
::Matches(OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>>,std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>>
                    ((tuple<testing::Matcher<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_&>
            ::Matches((MatcherBase<const_std::tuple<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>_>_&>
                       *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }